

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mu.c
# Opt level: O2

void nsync_maybe_merge_conditions_(nsync_dll_element_ *p,nsync_dll_element_ *n)

{
  int iVar1;
  void *pvVar2;
  void *pvVar3;
  
  if (n != (nsync_dll_element_ *)0x0 && p != (nsync_dll_element_ *)0x0) {
    pvVar3 = p->container;
    if ((*(long *)((long)pvVar3 + 0x50) != 0) &&
       (pvVar2 = n->container, *(long *)((long)pvVar3 + 0x50) == *(long *)((long)pvVar2 + 0x50))) {
      if (*(long *)((long)pvVar3 + 0x58) == *(long *)((long)pvVar2 + 0x58)) {
LAB_001051ca:
        nsync_dll_splice_after_
                  ((nsync_dll_element_ *)((long)pvVar3 + 0x68),
                   (nsync_dll_element_ *)((long)pvVar2 + 0x68));
        return;
      }
      if (*(code **)((long)pvVar3 + 0x60) != (code *)0x0) {
        iVar1 = (**(code **)((long)pvVar3 + 0x60))
                          (*(long *)((long)pvVar3 + 0x58),*(long *)((long)pvVar2 + 0x58));
        if (iVar1 != 0) {
          pvVar3 = p->container;
          pvVar2 = n->container;
          goto LAB_001051ca;
        }
      }
    }
  }
  return;
}

Assistant:

void nsync_maybe_merge_conditions_ (nsync_dll_element_ *p, nsync_dll_element_ *n) {
	if (p != NULL && n != NULL &&
	    WAIT_CONDITION_EQ (&DLL_WAITER (p)->cond, &DLL_WAITER (n)->cond)) {
		nsync_dll_splice_after_ (&DLL_WAITER (p)->same_condition,
				  &DLL_WAITER (n)->same_condition);
	}
}